

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Track::Write(Track *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  long lVar6;
  ContentEncoding *this_00;
  uint64_t uVar7;
  long *in_RSI;
  long *in_RDI;
  ContentEncoding *encoding_1;
  uint32_t i_1;
  ContentEncoding *encoding;
  uint32_t i;
  uint64_t content_encodings_size;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t size;
  uint64_t payload_size;
  IMkvWriter *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar8;
  uint local_44;
  IMkvWriter *writer_00;
  long local_28;
  bool local_1;
  
  if (in_RSI == (long *)0x0) {
    local_1 = false;
  }
  else if ((in_RDI[7] == 0) || (in_RDI[1] == 0)) {
    local_1 = false;
  }
  else {
    iVar2 = strcmp((char *)in_RDI[1],"V_AV1");
    if ((iVar2 == 0) && (in_RDI[2] == 0)) {
      local_1 = false;
    }
    else {
      (**(code **)(*in_RDI + 0x18))();
      bVar1 = WriteEbmlMasterElement
                        ((IMkvWriter *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                         ,(uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
      if (bVar1) {
        uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
        uVar4 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
        uVar5 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
        local_28 = uVar5 + uVar4 + uVar3;
        if (in_RDI[1] != 0) {
          uVar3 = EbmlElementSize(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                  (char *)in_stack_ffffffffffffffa0);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[2] != 0) {
          uVar3 = EbmlElementSize(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                  (uint8 *)in_stack_ffffffffffffffa0,(uint64)in_RDI);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[3] != 0) {
          uVar3 = EbmlElementSize(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                  (char *)in_stack_ffffffffffffffa0);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[5] != 0) {
          uVar3 = EbmlElementSize(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                  (char *)in_stack_ffffffffffffffa0);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[4] != 0) {
          uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[9] != 0) {
          uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[10] != 0) {
          uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
          local_28 = uVar3 + local_28;
        }
        if (in_RDI[0xb] != 0) {
          uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffa0,(uint64)in_RDI);
          local_28 = uVar3 + local_28;
        }
        lVar6 = (**(code **)(*in_RSI + 8))();
        if (lVar6 < 0) {
          local_1 = false;
        }
        else {
          bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x1607a5);
          if (bVar1) {
            bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x1607ca);
            if (bVar1) {
              bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x1607ef);
              if (bVar1) {
                if ((in_RDI[4] == 0) ||
                   (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x16081f),
                   bVar1)) {
                  if ((in_RDI[9] == 0) ||
                     (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x160851),
                     bVar1)) {
                    if ((in_RDI[10] == 0) ||
                       (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x160883),
                       bVar1)) {
                      if ((in_RDI[0xb] == 0) ||
                         (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffa0,(uint64)in_RDI,0x1608b5
                                                  ), bVar1)) {
                        if ((in_RDI[1] == 0) ||
                           (bVar1 = WriteEbmlElement((IMkvWriter *)
                                                     CONCAT44(in_stack_ffffffffffffffac,
                                                              in_stack_ffffffffffffffa8),
                                                     (uint64)in_stack_ffffffffffffffa0,
                                                     (char *)in_RDI), bVar1)) {
                          if ((in_RDI[2] == 0) ||
                             (bVar1 = WriteEbmlElement((IMkvWriter *)
                                                       CONCAT44(in_stack_ffffffffffffffac,
                                                                in_stack_ffffffffffffffa8),
                                                       (uint64)in_stack_ffffffffffffffa0,
                                                       (uint8 *)in_RDI,0x16091d), bVar1)) {
                            if ((in_RDI[3] == 0) ||
                               (bVar1 = WriteEbmlElement((IMkvWriter *)
                                                         CONCAT44(in_stack_ffffffffffffffac,
                                                                  in_stack_ffffffffffffffa8),
                                                         (uint64)in_stack_ffffffffffffffa0,
                                                         (char *)in_RDI), bVar1)) {
                              if ((in_RDI[5] == 0) ||
                                 (bVar1 = WriteEbmlElement((IMkvWriter *)
                                                           CONCAT44(in_stack_ffffffffffffffac,
                                                                    in_stack_ffffffffffffffa8),
                                                           (uint64)in_stack_ffffffffffffffa0,
                                                           (char *)in_RDI), bVar1)) {
                                this_00 = (ContentEncoding *)(**(code **)(*in_RSI + 8))();
                                if (((long)this_00 < 0) || ((long)this_00 - lVar6 != local_28)) {
                                  local_1 = false;
                                }
                                else {
                                  if ((int)in_RDI[0xe] != 0) {
                                    writer_00 = (IMkvWriter *)0x0;
                                    for (local_44 = 0; local_44 < *(uint *)(in_RDI + 0xe);
                                        local_44 = local_44 + 1) {
                                      uVar7 = ContentEncoding::Size
                                                        (*(ContentEncoding **)
                                                          (in_RDI[0xd] + (ulong)local_44 * 8));
                                      writer_00 = (IMkvWriter *)
                                                  ((long)&writer_00->_vptr_IMkvWriter + uVar7);
                                    }
                                    bVar1 = WriteEbmlMasterElement
                                                      ((IMkvWriter *)
                                                       CONCAT44(in_stack_ffffffffffffffac,
                                                                in_stack_ffffffffffffffa8),
                                                       (uint64)in_stack_ffffffffffffffa0,
                                                       (uint64)in_RDI);
                                    if (!bVar1) {
                                      return false;
                                    }
                                    for (uVar8 = 0; uVar8 < *(uint *)(in_RDI + 0xe);
                                        uVar8 = uVar8 + 1) {
                                      bVar1 = ContentEncoding::Write(this_00,writer_00);
                                      if (!bVar1) {
                                        return false;
                                      }
                                    }
                                  }
                                  lVar6 = (**(code **)(*in_RSI + 8))();
                                  if (lVar6 < 0) {
                                    local_1 = false;
                                  }
                                  else {
                                    local_1 = true;
                                  }
                                }
                              }
                              else {
                                local_1 = false;
                              }
                            }
                            else {
                              local_1 = false;
                            }
                          }
                          else {
                            local_1 = false;
                          }
                        }
                        else {
                          local_1 = false;
                        }
                      }
                      else {
                        local_1 = false;
                      }
                    }
                    else {
                      local_1 = false;
                    }
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool Track::Write(IMkvWriter* writer) const {
  if (!writer)
    return false;

  // mandatory elements without a default value.
  if (!type_ || !codec_id_)
    return false;

  // AV1 tracks require a CodecPrivate. See
  // https://github.com/ietf-wg-cellar/matroska-specification/blob/HEAD/codec/av1.md
  // TODO(tomfinegan): Update the above link to the AV1 Matroska mappings to
  // point to a stable version once it is finalized, or our own WebM mappings
  // page on webmproject.org should we decide to release them.
  if (!strcmp(codec_id_, Tracks::kAv1CodecId) && !codec_private_)
    return false;

  // |size| may be bigger than what is written out in this function because
  // derived classes may write out more data in the Track element.
  const uint64_t payload_size = PayloadSize();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTrackEntry, payload_size))
    return false;

  uint64_t size =
      EbmlElementSize(libwebm::kMkvTrackNumber, static_cast<uint64>(number_));
  size += EbmlElementSize(libwebm::kMkvTrackUID, static_cast<uint64>(uid_));
  size += EbmlElementSize(libwebm::kMkvTrackType, static_cast<uint64>(type_));
  if (codec_id_)
    size += EbmlElementSize(libwebm::kMkvCodecID, codec_id_);
  if (codec_private_)
    size += EbmlElementSize(libwebm::kMkvCodecPrivate, codec_private_,
                            static_cast<uint64>(codec_private_length_));
  if (language_)
    size += EbmlElementSize(libwebm::kMkvLanguage, language_);
  if (name_)
    size += EbmlElementSize(libwebm::kMkvName, name_);
  if (max_block_additional_id_)
    size += EbmlElementSize(libwebm::kMkvMaxBlockAdditionID,
                            static_cast<uint64>(max_block_additional_id_));
  if (codec_delay_)
    size += EbmlElementSize(libwebm::kMkvCodecDelay,
                            static_cast<uint64>(codec_delay_));
  if (seek_pre_roll_)
    size += EbmlElementSize(libwebm::kMkvSeekPreRoll,
                            static_cast<uint64>(seek_pre_roll_));
  if (default_duration_)
    size += EbmlElementSize(libwebm::kMkvDefaultDuration,
                            static_cast<uint64>(default_duration_));

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvTrackNumber,
                        static_cast<uint64>(number_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvTrackUID,
                        static_cast<uint64>(uid_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvTrackType,
                        static_cast<uint64>(type_)))
    return false;
  if (max_block_additional_id_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvMaxBlockAdditionID,
                          static_cast<uint64>(max_block_additional_id_))) {
      return false;
    }
  }
  if (codec_delay_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCodecDelay,
                          static_cast<uint64>(codec_delay_)))
      return false;
  }
  if (seek_pre_roll_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvSeekPreRoll,
                          static_cast<uint64>(seek_pre_roll_)))
      return false;
  }
  if (default_duration_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvDefaultDuration,
                          static_cast<uint64>(default_duration_)))
      return false;
  }
  if (codec_id_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCodecID, codec_id_))
      return false;
  }
  if (codec_private_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvCodecPrivate, codec_private_,
                          static_cast<uint64>(codec_private_length_)))
      return false;
  }
  if (language_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvLanguage, language_))
      return false;
  }
  if (name_) {
    if (!WriteEbmlElement(writer, libwebm::kMkvName, name_))
      return false;
  }

  int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  if (content_encoding_entries_size_ > 0) {
    uint64_t content_encodings_size = 0;
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      content_encodings_size += encoding->Size();
    }

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncodings,
                                content_encodings_size))
      return false;

    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      if (!encoding->Write(writer))
        return false;
    }
  }

  stop_position = writer->Position();
  if (stop_position < 0)
    return false;
  return true;
}